

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int x;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_01;
  int *piVar8;
  ulong uVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  uint v;
  ulong uVar12;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar5 = Acb_NtkStr(p,p->NameId);
  pcVar5 = Abc_UtilStrsav(pcVar5);
  p_00->pName = pcVar5;
  Vec_IntFill(&p->vObjCopy,(p->vObjType).nCap,-1);
  for (iVar11 = 0; iVar11 < (p->vCis).nSize; iVar11 = iVar11 + 1) {
    iVar2 = Vec_IntEntry(&p->vCis,iVar11);
    pGVar6 = Gia_ManAppendObj(p_00);
    uVar1 = *(ulong *)pGVar6;
    *(ulong *)pGVar6 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar6 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar7 = p_00->vCis;
    iVar3 = Gia_ObjId(p_00,pGVar6);
    Vec_IntPush(pVVar7,iVar3);
    iVar3 = Gia_ObjId(p_00,pGVar6);
    Acb_ObjSetCopy(p,iVar2,iVar3 * 2);
  }
  pVVar7 = Vec_IntAlloc(4);
  p_01 = Acb_NtkFindNodes2(p);
  iVar11 = p_01->nSize;
  iVar2 = 0;
  if (iVar11 < 1) {
    iVar11 = 0;
    iVar2 = 0;
  }
  for (; iVar11 != iVar2; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(p_01,iVar2);
    x = Acb_ObjToGia2(p_00,p,iVar3,pVVar7);
    Acb_ObjSetCopy(p,iVar3,x);
  }
  Vec_IntFree(p_01);
  Vec_IntFree(pVVar7);
  iVar11 = 0;
  while( true ) {
    if ((p->vCos).nSize <= iVar11) {
      pGVar10 = Gia_ManCleanup(p_00);
      Gia_ManUpdateCopy(&p->vObjCopy,p_00);
      Gia_ManStop(p_00);
      return pGVar10;
    }
    iVar2 = Vec_IntEntry(&p->vCos,iVar11);
    piVar8 = Acb_ObjFanins(p,iVar2);
    uVar4 = Acb_ObjCopy(p,piVar8[1]);
    if (((int)uVar4 < 0) || (v = uVar4 >> 1, p_00->nObjs <= (int)v)) break;
    pGVar6 = Gia_ManObj(p_00,v);
    if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && (int)*(uint *)pGVar6 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                    ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar6 = Gia_ManAppendObj(p_00);
    *(ulong *)pGVar6 = *(ulong *)pGVar6 | 0x80000000;
    iVar2 = Gia_ObjId(p_00,pGVar6);
    uVar9 = (ulong)(iVar2 - v & 0x1fffffff);
    uVar1 = *(ulong *)pGVar6;
    uVar12 = (ulong)((uVar4 & 1) << 0x1d);
    *(ulong *)pGVar6 = uVar12 | uVar1 & 0xffffffffc0000000 | uVar9;
    *(ulong *)pGVar6 =
         uVar12 | uVar1 & 0xe0000000c0000000 | uVar9 |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar7 = p_00->vCos;
    iVar2 = Gia_ObjId(p_00,pGVar6);
    Vec_IntPush(pVVar7,iVar2);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff),pGVar6);
    }
    Gia_ObjId(p_00,pGVar6);
    iVar11 = iVar11 + 1;
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, p, iObj, vFanins) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}